

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O0

void __thiscall
helics::TranslatorFederate::TranslatorFederate
          (TranslatorFederate *this,GlobalFederateId fedID,string *name,GlobalBrokerId coreID,
          Core *param_5)

{
  TimeRepresentation<count_time<9,_long>_> TVar1;
  int timeProperty;
  BaseType in_ECX;
  GlobalFederateId in_ESI;
  BaseType *in_RDI;
  MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle> *in_stack_ffffffffffffff30;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff38;
  TimeCoordinator *this_00;
  function<void_(const_helics::ActionMessage_&)> *in_stack_ffffffffffffff40;
  Time propertyVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  TimeCoordinator *in_stack_ffffffffffffff70;
  
  *in_RDI = in_ESI.gid;
  in_RDI[1] = in_ECX;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::function<void(helics::ActionMessage_const&)>::
  function<helics::TranslatorFederate::TranslatorFederate(helics::GlobalFederateId,std::__cxx11::string,helics::GlobalBrokerId,helics::Core*)::__0,void>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  TimeCoordinator::TimeCoordinator
            (in_stack_ffffffffffffff70,
             (function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffff68);
  CLI::std::function<void_(const_helics::ActionMessage_&)>::~function
            ((function<void_(const_helics::ActionMessage_&)> *)0x5d2c48);
  in_RDI[0xa4] = 0;
  in_RDI[0xa5] = 0;
  *(undefined1 *)(in_RDI + 0xa6) = 0;
  *(undefined1 *)((long)in_RDI + 0x299) = 0;
  this_00 = (TimeCoordinator *)(in_RDI + 0xa8);
  std::function<void_(const_helics::ActionMessage_&)>::function
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffff30);
  propertyVal.internalTimeCode = (baseType)(in_RDI + 0xb0);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_ffffffffffffff30);
  std::function<void_(const_helics::ActionMessage_&)>::function
            ((function<void_(const_helics::ActionMessage_&)> *)in_stack_ffffffffffffff30);
  std::function<void_(helics::ActionMessage_&&)>::function
            ((function<void_(helics::ActionMessage_&&)> *)in_stack_ffffffffffffff30);
  std::function<void_(helics::ActionMessage_&)>::function
            ((function<void_(helics::ActionMessage_&)> *)in_stack_ffffffffffffff30);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)in_stack_ffffffffffffff30);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  function((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
            *)in_stack_ffffffffffffff30);
  TVar1 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  *(baseType *)(in_RDI + 0xe0) = TVar1.internalTimeCode;
  gmlc::containers::MappedPointerVector<helics::TranslatorInfo,_helics::GlobalHandle>::
  MappedPointerVector(in_stack_ffffffffffffff30);
  BaseTimeCoordinator::setSourceId((BaseTimeCoordinator *)(in_RDI + 10),in_ESI);
  TimeCoordinator::setOptionFlag((TimeCoordinator *)(in_RDI + 10),0x51,true);
  TimeCoordinator::specifyNonGranting((TimeCoordinator *)(in_RDI + 10),true);
  timeProperty = (int)((ulong)(in_RDI + 10) >> 0x20);
  TimeRepresentation<count_time<9,_long>_>::epsilon();
  TimeCoordinator::setProperty(this_00,timeProperty,propertyVal);
  return;
}

Assistant:

TranslatorFederate::TranslatorFederate(GlobalFederateId fedID,
                                       std::string name,
                                       GlobalBrokerId coreID,
                                       Core* /*core*/):
    mFedID(fedID), mCoreID(coreID), mName(std::move(name)), /*mCore(core),*/
    mCoord([this](const ActionMessage& msg) { routeMessage(msg); })
{
    mCoord.setSourceId(fedID);
    mCoord.setOptionFlag(helics::defs::Flags::EVENT_TRIGGERED, true);
    mCoord.specifyNonGranting(true);
    mCoord.setProperty(HELICS_PROPERTY_TIME_OUTPUT_DELAY, Time::epsilon());
}